

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall perfetto::protos::gen::TraceConfig::TraceConfig(TraceConfig *this)

{
  (this->super_CppMessageObj)._vptr_CppMessageObj = (_func_int **)&PTR__TraceConfig_00407a00;
  (this->buffers_).
  super__Vector_base<perfetto::protos::gen::TraceConfig_BufferConfig,_std::allocator<perfetto::protos::gen::TraceConfig_BufferConfig>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->buffers_).
  super__Vector_base<perfetto::protos::gen::TraceConfig_BufferConfig,_std::allocator<perfetto::protos::gen::TraceConfig_BufferConfig>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->buffers_).
  super__Vector_base<perfetto::protos::gen::TraceConfig_BufferConfig,_std::allocator<perfetto::protos::gen::TraceConfig_BufferConfig>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->data_sources_).
  super__Vector_base<perfetto::protos::gen::TraceConfig_DataSource,_std::allocator<perfetto::protos::gen::TraceConfig_DataSource>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->data_sources_).
  super__Vector_base<perfetto::protos::gen::TraceConfig_DataSource,_std::allocator<perfetto::protos::gen::TraceConfig_DataSource>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->data_sources_).
  super__Vector_base<perfetto::protos::gen::TraceConfig_DataSource,_std::allocator<perfetto::protos::gen::TraceConfig_DataSource>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  protozero::CopyablePtr<perfetto::protos::gen::TraceConfig_BuiltinDataSource>::CopyablePtr
            (&this->builtin_data_sources_);
  this->duration_ms_ = 0;
  this->enable_extra_guardrails_ = false;
  this->lockdown_mode_ = TraceConfig_LockdownModeOperation_LOCKDOWN_UNCHANGED;
  (this->producers_).
  super__Vector_base<perfetto::protos::gen::TraceConfig_ProducerConfig,_std::allocator<perfetto::protos::gen::TraceConfig_ProducerConfig>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->producers_).
  super__Vector_base<perfetto::protos::gen::TraceConfig_ProducerConfig,_std::allocator<perfetto::protos::gen::TraceConfig_ProducerConfig>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->producers_).
  super__Vector_base<perfetto::protos::gen::TraceConfig_ProducerConfig,_std::allocator<perfetto::protos::gen::TraceConfig_ProducerConfig>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  protozero::CopyablePtr<perfetto::protos::gen::TraceConfig_StatsdMetadata>::CopyablePtr
            (&this->statsd_metadata_);
  this->write_into_file_ = false;
  (this->output_path_)._M_dataplus._M_p = (pointer)&(this->output_path_).field_2;
  (this->output_path_)._M_string_length = 0;
  (this->output_path_).field_2._M_local_buf[0] = '\0';
  this->file_write_period_ms_ = 0;
  this->max_file_size_bytes_ = 0;
  protozero::CopyablePtr<perfetto::protos::gen::TraceConfig_GuardrailOverrides>::CopyablePtr
            (&this->guardrail_overrides_);
  this->deferred_start_ = false;
  this->bugreport_score_ = 0;
  this->flush_period_ms_ = 0;
  this->flush_timeout_ms_ = 0;
  *(undefined8 *)((long)&this->flush_timeout_ms_ + 1) = 0;
  protozero::CopyablePtr<perfetto::protos::gen::TraceConfig_TriggerConfig>::CopyablePtr
            (&this->trigger_config_);
  (this->activate_triggers_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->activate_triggers_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->activate_triggers_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  protozero::CopyablePtr<perfetto::protos::gen::TraceConfig_IncrementalStateConfig>::CopyablePtr
            (&this->incremental_state_config_);
  this->allow_user_build_tracing_ = false;
  (this->unique_session_name_)._M_dataplus._M_p = (pointer)&(this->unique_session_name_).field_2;
  (this->unique_session_name_)._M_string_length = 0;
  (this->unique_session_name_).field_2._M_local_buf[0] = '\0';
  this->compression_type_ = TraceConfig_CompressionType_COMPRESSION_TYPE_UNSPECIFIED;
  protozero::CopyablePtr<perfetto::protos::gen::TraceConfig_IncidentReportConfig>::CopyablePtr
            (&this->incident_report_config_);
  this->statsd_logging_ = TraceConfig_StatsdLogging_STATSD_LOGGING_UNSPECIFIED;
  this->trace_uuid_msb_ = 0;
  this->trace_uuid_lsb_ = 0;
  protozero::CopyablePtr<perfetto::protos::gen::TraceConfig_TraceFilter>::CopyablePtr
            (&this->trace_filter_);
  protozero::CopyablePtr<perfetto::protos::gen::TraceConfig_AndroidReportConfig>::CopyablePtr
            (&this->android_report_config_);
  protozero::CopyablePtr<perfetto::protos::gen::TraceConfig_CmdTraceStartDelay>::CopyablePtr
            (&this->cmd_trace_start_delay_);
  (this->unknown_fields_)._M_dataplus._M_p = (pointer)&(this->unknown_fields_).field_2;
  (this->unknown_fields_)._M_string_length = 0;
  (this->unknown_fields_).field_2._M_local_buf[0] = '\0';
  (this->_has_field_).super__Base_bitset<1UL>._M_w = 0;
  return;
}

Assistant:

TraceConfig::TraceConfig() = default;